

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

_Bool store_menu_handle(menu *m,ui_event *event,wchar_t oid)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  store_context *ctx_00;
  keypress kp;
  _Bool action;
  _Bool purchased;
  store_conflict *store;
  store_context *ctx;
  _Bool processed;
  wchar_t oid_local;
  ui_event *event_local;
  menu *m_local;
  
  ctx._3_1_ = true;
  ctx_00 = (store_context *)menu_priv(m);
  if (event->type == EVT_SELECT) {
    _Var2 = context_menu_store_item(ctx_00,oid,L'\x01',(m->active).row + oid);
    ctx_00->flags = ctx_00->flags | 3;
    cmdq_pop(CTX_STORE);
    notice_stuff(player);
    handle_stuff(player);
    if (_Var2) {
      store_display_recalc(ctx_00);
      store_menu_recalc(m);
      store_redraw(ctx_00);
    }
    m_local._7_1_ = true;
  }
  else {
    if (event->type == EVT_MOUSE) {
      if ((event->mouse).button == '\x02') {
        return false;
      }
      if ((event->mouse).button == '\x01') {
        bVar1 = false;
        if (((event->mouse).y == '\0') || ((event->mouse).y == '\x01')) {
          wVar3 = context_menu_store(ctx_00,oid,(uint)(event->mouse).x,(uint)(event->mouse).y);
          if (wVar3 == L'\0') {
            return false;
          }
          bVar1 = true;
        }
        else if ((L'\xffffffff' < oid) && ((uint)(event->mouse).y == (m->active).row + oid)) {
          context_menu_store_item(ctx_00,oid,(uint)(event->mouse).x,(uint)(event->mouse).y);
          bVar1 = true;
        }
        if (bVar1) {
          ctx_00->flags = ctx_00->flags | 3;
          cmdq_pop(CTX_STORE);
          notice_stuff(player);
          handle_stuff(player);
          store_display_recalc(ctx_00);
          store_menu_recalc(m);
          store_redraw(ctx_00);
          return true;
        }
      }
    }
    else if (event->type == EVT_KBRD) {
      switch((event->key).code) {
      case 0x3d:
        do_cmd_options();
        store_menu_set_selections(m,false);
        break;
      default:
        kp._9_3_ = 0;
        kp._0_9_ = *(unkuint9 *)event;
        ctx._3_1_ = store_process_command_key(kp);
        break;
      case 0x3f:
        if ((ctx_00->flags & 4U) == 0) {
          ctx_00->flags = ctx_00->flags | 4;
        }
        else {
          ctx_00->flags = ctx_00->flags & 0xfffffffb;
        }
        ctx_00->flags = ctx_00->flags | 3;
        store_display_recalc(ctx_00);
        store_redraw(ctx_00);
        break;
      case 100:
      case 0x73:
        store_sell(ctx_00);
        break;
      case 0x67:
      case 0x70:
        msg_flag = false;
        if (ctx_00->store->feat == 0xe) {
          prt("Get which item? (Esc to cancel, Enter to select)",L'\0',L'\0');
        }
        else {
          prt("Purchase which item? (ESC to cancel, Enter to select)",L'\0',L'\0');
        }
        wVar3 = store_get_stock(m,oid);
        prt("",L'\0',L'\0');
        if (L'\xffffffff' < wVar3) {
          store_purchase(ctx_00,wVar3,false);
        }
        break;
      case 0x6c:
      case 0x78:
        msg_flag = false;
        prt("Examine which item? (ESC to cancel, Enter to select)",L'\0',L'\0');
        wVar3 = store_get_stock(m,oid);
        prt("",L'\0',L'\0');
        if (L'\xffffffff' < wVar3) {
          store_examine(ctx_00,wVar3);
        }
      }
      cmdq_pop(CTX_STORE);
      if (ctx._3_1_ != false) {
        event_signal(EVENT_INVENTORY);
        event_signal(EVENT_EQUIPMENT);
      }
      notice_stuff(player);
      handle_stuff(player);
      return ctx._3_1_;
    }
    m_local._7_1_ = false;
  }
  return m_local._7_1_;
}

Assistant:

static bool store_menu_handle(struct menu *m, const ui_event *event, int oid)
{
	bool processed = true;
	struct store_context *ctx = menu_priv(m);
	struct store *store = ctx->store;
	
	if (event->type == EVT_SELECT) {
		/* Hack -- there's no mouse event coordinates to use for */
		/* menu_store_item, so fake one as if mouse clicked on letter */
		bool purchased = context_menu_store_item(ctx, oid, 1, m->active.row + oid);
		ctx->flags |= (STORE_FRAME_CHANGE | STORE_GOLD_CHANGE);

		/* Let the game handle any core commands (equipping, etc) */
		cmdq_pop(CTX_STORE);

		/* Notice and handle stuff */
		notice_stuff(player);
		handle_stuff(player);

		if (purchased) {
			/* Display the store */
			store_display_recalc(ctx);
			store_menu_recalc(m);
			store_redraw(ctx);
		}

		return true;
	} else if (event->type == EVT_MOUSE) {
		if (event->mouse.button == 2) {
			/* exit the store? what already does this? menu_handle_mouse
			 * so exit this so that menu_handle_mouse will be called */
			return false;
		} else if (event->mouse.button == 1) {
			bool action = false;
			if ((event->mouse.y == 0) || (event->mouse.y == 1)) {
				/* show the store context menu */
				if (context_menu_store(ctx, oid, event->mouse.x, event->mouse.y) == false)
					return false;

				action = true;
			} else if ((oid >= 0) && (event->mouse.y == m->active.row + oid)) {
				/* if press is on a list item, so store item context */
				context_menu_store_item(ctx, oid, event->mouse.x,
										event->mouse.y);
				action = true;
			}

			if (action) {
				ctx->flags |= (STORE_FRAME_CHANGE | STORE_GOLD_CHANGE);

				/* Let the game handle any core commands (equipping, etc) */
				cmdq_pop(CTX_STORE);

				/* Notice and handle stuff */
				notice_stuff(player);
				handle_stuff(player);

				/* Display the store */
				store_display_recalc(ctx);
				store_menu_recalc(m);
				store_redraw(ctx);

				return true;
			}
		}
	} else if (event->type == EVT_KBRD) {
		switch (event->key.code) {
			case 's':
			case 'd': store_sell(ctx); break;

			case 'p':
			case 'g':
				/* use the old way of purchasing items */
				msg_flag = false;
				if (store->feat != FEAT_HOME) {
					prt("Purchase which item? (ESC to cancel, Enter to select)",
						0, 0);
				} else {
					prt("Get which item? (Esc to cancel, Enter to select)",
						0, 0);
				}
				oid = store_get_stock(m, oid);
				prt("", 0, 0);
				if (oid >= 0) {
					store_purchase(ctx, oid, false);
				}
				break;
			case 'l':
			case 'x':
				/* use the old way of examining items */
				msg_flag = false;
				prt("Examine which item? (ESC to cancel, Enter to select)",
					0, 0);
				oid = store_get_stock(m, oid);
				prt("", 0, 0);
				if (oid >= 0) {
					store_examine(ctx, oid);
				}
				break;

			case '?': {
				/* Toggle help */
				if (ctx->flags & STORE_SHOW_HELP)
					ctx->flags &= ~(STORE_SHOW_HELP);
				else
					ctx->flags |= STORE_SHOW_HELP;

				/* Redisplay */
				ctx->flags |= STORE_INIT_CHANGE;

				store_display_recalc(ctx);
				store_redraw(ctx);

				break;
			}

			case '=': {
				do_cmd_options();
				store_menu_set_selections(m, false);
				break;
			}

			default:
				processed = store_process_command_key(event->key);
		}

		/* Let the game handle any core commands (equipping, etc) */
		cmdq_pop(CTX_STORE);

		if (processed) {
			event_signal(EVENT_INVENTORY);
			event_signal(EVENT_EQUIPMENT);
		}

		/* Notice and handle stuff */
		notice_stuff(player);
		handle_stuff(player);

		return processed;
	}

	return false;
}